

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void probehelp(int longlist)

{
  int longlist_local;
  
  fprintf(_stderr,"\nSyntax: probe input.pdb >> out.kin\n");
  fprintf(_stderr,
          "    or: probe [flags] \"src pattern\" [\"target pattern\"] pdbfiles... >> out.kin\n\n");
  fprintf(_stderr,"Flags:\n");
  fprintf(_stderr,"  -SElf  self intersection:   src  -> src (default)\n");
  fprintf(_stderr,"  -Both  intersect both ways: src <=> targ\n");
  fprintf(_stderr,"  -ONce  single intersection: src  -> targ\n");
  fprintf(_stderr,"  -OUt   external van der Waals surface of src (solvent contact surface)\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"  -AUTObondrot filename    read and process an autobondrot file\n");
  if (longlist == 0) {
    fprintf(_stderr,
            "\n  shortcuts: <<NO FLAGS>>, -SCSurface, -EXPOsed, -ASurface, -ACCESS, -SCAN0, -SCAN1\n"
           );
    fprintf(_stderr,"\n most simple dotkin: probe -self all -kinemage input.pdb > out.kin\n");
  }
  else {
    fprintf(_stderr,"\n  shortcuts:\n");
    fprintf(_stderr," <<NO FLAGS>>same as: -4H -mc -het -self \"altA ogt33\"\n");
    fprintf(_stderr,"  -DEFAULTs  same as: <<NO FLAGS>>, but allows some other flags\n");
    fprintf(_stderr,"  -SCSurface same as: -drop -rad1.4         -out \"not water\"\n");
    fprintf(_stderr,
            "  -EXPOsed   same as: -drop -rad1.4         -out      (note: user supplies pattern)\n")
    ;
    fprintf(_stderr,"  -ASurface  same as: -drop -rad0.0 -add1.4 -out \"not water\"\n");
    fprintf(_stderr,
            "  -ACCESS    same as: -drop -rad0.0 -add1.4 -out      (note: user supplies pattern)\n")
    ;
    fprintf(_stderr,"  -SCAN0 same as: -4H -mc -self \"alta blt40 ogt33\"\n");
    fprintf(_stderr,
            "  -SCAN1 same as: -4H -once \"sc alta blt40 ogt33\" \"alta blt40 ogt65,(not water ogt33)\"\n"
           );
    fprintf(_stderr,"\n");
    fprintf(_stderr,"  -DUMPAtominfo   count the atoms in the selection: src\n\n");
    fprintf(_stderr,"  (note that BOTH and ONCE require two patterns while\n");
    fprintf(_stderr,"   OUT, SELF and DUMPATOMINFO require just one pattern)\n\n");
    fprintf(_stderr,"  -Implicit    implicit hydrogens\n");
    fprintf(_stderr,"  -Explicit    explicit hydrogens (default)\n");
    fprintf(_stderr,"  -DEnsity#    set dot density (default 16 dots/sq A)\n");
    fprintf(_stderr,"  -Radius#.#   set probe radius (default 0.25 A)\n");
    fprintf(_stderr,"  -ADDvdw#.#   offset added to Van der Waals radii (default 0.0)\n");
    fprintf(_stderr,"  -SCALEvdw#.# scale factor for Van der Waals radii (default 1.0)\n");
    fprintf(_stderr,"  -COSCale#.#  scale C=O carbon Van der Waals radii (default 0.94)\n");
    fprintf(_stderr,"  -SPike       draw spike instead of dots (default)\n");
    fprintf(_stderr,"  -SPike#.#    set spike scale (default=0.5)\n");
    fprintf(_stderr,"  -NOSpike     draw only dots\n");
    fprintf(_stderr,"  -HBRegular#.# max overlap for regular Hbonds(default=%.1f)\n",
            (double)Min_regular_hb_cutoff);
    fprintf(_stderr,"  -HBCharged#.# max overlap for charged Hbonds(default=%.1f)\n",
            (double)Min_charged_hb_cutoff);
    fprintf(_stderr,"  -Keep        keep nonselected atoms (default)\n");
    fprintf(_stderr,"  -DRop        drop nonselected atoms\n");
    fprintf(_stderr,"  -LIMit       limit bump dots to max dist when kissing (default)\n");
    fprintf(_stderr,"  -NOLIMit     do not limit bump dots\n");
    fprintf(_stderr,"  -LENs        add lens keyword to kin file\n");
    fprintf(_stderr,"  -NOLENs      do not add lens keyword to kin file (default)\n");
    fprintf(_stderr,"  -MC          include mainchain->mainchain interactions\n");
    fprintf(_stderr,"  -HETs        include dots to non-water HET groups (default)\n");
    fprintf(_stderr,"  -NOHETs      exclude dots to non-water HET groups\n");
    fprintf(_stderr,"  -WATers      include dots to water (default)\n");
    fprintf(_stderr,"  -NOWATers    exclude dots to water\n");
    fprintf(_stderr,"  -WAT2wat     show dots between waters\n");
    fprintf(_stderr,"  -DUMPH2O     include water H? vectorlist in output\n");
    fprintf(_stderr,"  -4H          extend bond chain dot removal to 4 for H (default)\n");
    fprintf(_stderr,"  -3           limit bond chain dot removal to 3\n");
    fprintf(_stderr,"  -2           limit bond chain dot removal to 2\n");
    fprintf(_stderr,"  -1           limit bond chain dot removal to 1\n");
    fprintf(_stderr,"  -IGNORE \"pattern\" explicit drop: ignore atoms selected by pattern\n");
    fprintf(_stderr,"  -DOCHO       recognize CH..O Hbonds\n");
    fprintf(_stderr,"  -CHO#.#      scale factor for CH..O Hbond score (default=%.1f)\n",
            (double)CHOHBfactor);
    fprintf(_stderr,"  -PolarH      use short radii of polar hydrogens (default)\n");
    fprintf(_stderr,"  -NOPolarH    do not shorten radii of polar hydrogens\n");
    fprintf(_stderr,"  -NUClear     use nuclear position vdW radii\n");
    fprintf(_stderr,"               (default is electron cloud positions)\n");
    fprintf(_stderr,"  -NOFACEhbond do not identify HBonds to aromatic faces\n\n");
    fprintf(_stderr,"  -Name \"name\" specify the group name (default \"dots\")\n");
    fprintf(_stderr,"  -DOTMASTER  group name used as extra master={name} on lists\n");
    fprintf(_stderr,"  -NOGroup     do not generate @group statement in .kin format output\n");
    fprintf(_stderr,"  -KINemage    add @kinemage 1 statement to top of .kin format output\n\n");
    fprintf(_stderr,"  -Countdots   produce a count of dots-not a dotlist\n");
    fprintf(_stderr,"  -Unformated  output raw dot info\n");
    fprintf(_stderr,
            "     name:pat:type:srcAtom:targAtom:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n"
           );
    fprintf(_stderr,
            "  -CONdense    raw output in condensed format, i.e. one line per source->target atom. Also gives the dot count for that interaction. Works only with -Unformated flag\n"
           );
    fprintf(_stderr,
            "     name:pat:type:srcAtom:targAtom:dot-count:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n"
           );
    fprintf(_stderr,"  -OFORMAT     output dot info formatted for display in O\n");
    fprintf(_stderr,"  -XVFORMAT    output dot info formatted for display in XtalView\n");
    fprintf(_stderr,"  -ONELINE     output one line :contacts:by:severity:type:\n");
    fprintf(_stderr,"  -ONEDOTeach  output one dot for each src-to-neighbor\n");
    fprintf(_stderr,"               With -Unformated flag: for H gives angle parent-src-cause,\n");
    fprintf(_stderr,
            "     name:pat:type:srcAtom:targAtom:XHTangle:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n"
           );
    fprintf(_stderr,"  -GAPBINs     2nd pointmaster character, -.5...0...+.5\n");
    fprintf(_stderr,"  -NEAREST     apply selection only on nearest neighbor\n");
    fprintf(_stderr,"  -FILTERnearest apply 3rd selection on neighbor\n");
    fprintf(_stderr," e.g. -nearest -filternearest patt1 all patt3\n");
    fprintf(_stderr,"  -OCC1filter  final filter exclude any w occ < 1\n");
    fprintf(_stderr,"  -NOALTfilter final filter exclude any alts\n");
    fprintf(_stderr,"  -GAPcolor    color dots by gap amount (default)\n");
    fprintf(_stderr,"  -ATOMcolor   color dots by atom type\n");
    fprintf(_stderr,"  -BASEcolor   color dots by nucleic acid base type\n");
    fprintf(_stderr,"  -COLORBase   color dots by gap and nucleic acid base type\n");
    fprintf(_stderr,"  -OUTCOLor \"name\" specify the point color for -OUT (default \"gray\")\n");
    fprintf(_stderr,"  -GAPWeight#  set weight for scoring gaps (default 0.25)\n");
    fprintf(_stderr,"  -BUMPWeight# set relative scale for scoring bumps (default 10.0)\n");
    fprintf(_stderr,"  -HBWeight#   set relative scale for scoring Hbonds (default 4.0)\n");
    fprintf(_stderr,"  -DIVLow#.#   Division for Bump categories    (default -0.4)\n");
    fprintf(_stderr,"  -DIVHigh#.#  Division for Contact categories (default  0.25)\n");
    fprintf(_stderr,
            "  -DIVWorse#.#  Division for regarding a clash as a worse clash (default  -0.5)\n");
    fprintf(_stderr,
            "  -SEPWORSE    To separate bad overlaps and worse overlaps (default false, if true, deafult value to separate the worse clashes is -0.5)\n"
           );
    fprintf(_stderr,"  -MINOCCupancy#.#  Occupancy below this is same as zero (default  0.02)\n");
    fprintf(_stderr,"  -ELEMent     add master buttons for different elements in kin output\n");
    fprintf(_stderr,"  -NOHBOUT     do not output contacts for HBonds\n");
    fprintf(_stderr,"  -NOCLASHOUT  do not output contacts for clashes\n");
    fprintf(_stderr,"  -NOVDWOUT    do not output contacts for van der Waals interactions\n");
    fprintf(_stderr,"  -ONLYBADOUT  onlybadout output bad clashes (severe overlap contacts)\n");
    fprintf(_stderr,"  -SUMMARY     output summary list of contacts and clashes\n");
    fprintf(_stderr,"  -ONELINE     output summary list on oneline\n");
    fprintf(_stderr,"  -NOTICKs     do not display the residue name ticker during processing\n");
    fprintf(_stderr,"  -STDBONDs    assume only standard bonding patterns in standard residues\n");
    fprintf(_stderr,"  -NOPARENT    do not bond hydrogens based on table of parent heavy atoms\n\n")
    ;
    fprintf(_stderr,"  -SEGID       use the PDB SegID field to descriminate between residues\n");
    fprintf(_stderr,"  -OLDU        generate old style -u output: kissEdge2BullsEye, etc\n");
    fprintf(_stderr,"  -VErbose     verbose mode (default)\n");
    fprintf(_stderr,"  -DOTDUMP     dump dot info while doing examineDots()\n");
    fprintf(_stderr,
            "  -DUMPATOMS filename  dump atom information to filename for regression testing\n");
    fprintf(_stderr,"  -REFerence   display reference string\n");
    fprintf(_stderr,"  -CHANGEs     display a list of program changes\n");
    fprintf(_stderr,"  -Quiet       quiet mode\n");
  }
  fprintf(_stderr,"\n  -Help  show expanded help notice (includes other flags)\n");
  fprintf(_stderr,"\n  -VERSION   one line version to stdout\n\n");
  fprintf(_stderr,"Pattern elements:  (should be put in quotes on the command line)\n");
  if (longlist == 0) {
    fprintf(_stderr,"   #         residue number\n");
    fprintf(_stderr,"   #a        residue #, insert a\n");
    fprintf(_stderr,"   #-#       residue number range\n");
    fprintf(_stderr,"   a OR aaa  residue type by one or three letter codes\n");
    fprintf(_stderr,"   FILE#,MODEL#,CHAINa,SEGaaaa,ALTa,ATOMaaaa,RESaaa,\n");
    fprintf(_stderr,"   ALL,PROTEIN,MC,SC,BASE,ALPHA,BETA,NITROGEN,CARBON,OXYGEN,\n");
    fprintf(_stderr,"   SULFUR,PHOSPHORUS,HYDROGEN,METAL,POLAR,NONPOLAR,CHARGED,\n");
    fprintf(_stderr,"   DONOR,ACCEPTOR,AROMATIC,METHYLENE,METHYL,HET,WATER,DNA,RNA,\n");
    fprintf(_stderr,"   OLT#, OGT#, BLT#, BGT#, INSa, WITHIN #.# OF #.#, #.#, #.#\n");
  }
  else {
    fprintf(_stderr,"   FILE#     within file #\n");
    fprintf(_stderr,"   MODEL#    within model #\n");
    fprintf(_stderr,"   CHAINaa   within chain a\n");
    fprintf(_stderr,"   SEGaaaa   segment identifier aaaa (where _ represents blank)\n");
    fprintf(_stderr,"   ALTa      alternate conformation a\n");
    fprintf(_stderr,"   ATOMaaaa  atom name aaaa (where _ represents blank)\n");
    fprintf(_stderr,"             (all 4 characters are used so H would be ATOM_H__)\n");
    fprintf(_stderr,"   RESaaa    residue aaa\n");
    fprintf(_stderr,"   #         residue #\n");
    fprintf(_stderr,"   #a        residue #, insert a\n");
    fprintf(_stderr,"   #-#       residue range # (insert codes ignored)\n");
    fprintf(_stderr,"   a         residue type by one letter codes   (eg. y)\n");
    fprintf(_stderr,"   aaa       residue type by three letter codes (eg. tyr)\n");
    fprintf(_stderr,"   ALL,PROTEIN,MC,SC,BASE,ALPHA,BETA,NITROGEN,CARBON,OXYGEN,\n");
    fprintf(_stderr,"   SULFUR,PHOSPHORUS,HYDROGEN,METAL,POLAR,NONPOLAR,CHARGED,\n");
    fprintf(_stderr,"   DONOR,ACCEPTOR,AROMATIC,METHYLENE,METHYL,HET,WATER,DNA,RNA\n");
    fprintf(_stderr,"             all or a subset of the atoms\n");
    fprintf(_stderr,"   OLT#      Occupancy less than # (integer percent)\n");
    fprintf(_stderr,"   OGT#      Occupancy greater than # (integer percent)\n");
    fprintf(_stderr,"   BLT#      B-value less than # (integer)\n");
    fprintf(_stderr,"   BGT#      B-value greater than # (integer)\n");
    fprintf(_stderr,"   INSa      Insert code a (where _ represents blank)\n");
    fprintf(_stderr,"   \n");
    fprintf(_stderr,"   WITHIN #.# OF #.#, #.#, #.#   atoms within distance from point\n");
  }
  fprintf(_stderr,"   \n");
  fprintf(_stderr,"   Patterns can be combined into comma separated lists\n");
  fprintf(_stderr,"   such as \"trp,phe,tyr\" meaning TRP or PHE or TYR.\n");
  fprintf(_stderr,"   \n");
  fprintf(_stderr,"   Patterns that are sepatated by blanks must all be true\n");
  fprintf(_stderr,"   such as \"chainb 1-5\" meaning residues 1 to 5 in chain B.\n");
  fprintf(_stderr,"   \n");
  fprintf(_stderr,"   You can also group patterns with parenthesis, separate\n");
  fprintf(_stderr,"   multiple patterns with | meaning \'or\' and choose the\n");
  fprintf(_stderr,"   complement with NOT as in \"not file1\" meaning not in file 1.\n");
  fprintf(_stderr,"\n");
  fprintf(_stderr,"   An autobondrot file is similar to other PDB input files\n");
  fprintf(_stderr,"   but it includes information identifying atoms subject to rotations\n");
  fprintf(_stderr,"   and other transformations.\n");
  if (longlist != 0) {
    fprintf(_stderr,"\n   Example autobondrot file fragment showing Calpha-Cbeta bond rotation\n");
    fprintf(_stderr,"   and a periodic torsion penalty function for this rotation\n");
    fprintf(_stderr,"     ATOM      1  CB  TYR    61      34.219  17.937   4.659  1.00  0.00\n");
    fprintf(_stderr,"     bondrot:chi1:78.7:  0:359:5:33.138:18.517: 5.531:34.219:17.937: 4.659\n");
    fprintf(_stderr,"     cos:-3:60:3:\n");
    fprintf(_stderr,"     ATOM      1 1HB  TYR    61      34.766  18.777   4.206  1.00  0.00\n");
    fprintf(_stderr,"     ATOM      1 2HB  TYR    61      34.927  17.409   5.315  1.00  0.00\n");
    fprintf(_stderr,"     ATOM      1  CG  TYR    61      33.836  16.989   3.546  1.00  0.00\n");
    fprintf(_stderr,"     ...\n");
    fprintf(_stderr,"   Autobondrot commands use colons to separate values\n");
    fprintf(_stderr,"   Transformations: BONDROT:id:currAng:start:end:stepSz:x1:y1:z1:x2:y2:z2\n");
    fprintf(_stderr,"                    TRANS:  id:currpos:start:end:stepSz:x1:y1:z1:x2:y2:z2\n");
    fprintf(_stderr,"                    NULL  # dummy\n");
    fprintf(_stderr,"   Bias functions:  COS:scale:phaseOffset:frequency\n");
    fprintf(_stderr,"                    POLY:scale:offset:polynomialDegree\n");
    fprintf(_stderr,"                    CONST:value\n");
    fprintf(_stderr,"   Branching:       SAVE and RESTORE or \"(\" and \")\"\n");
    fprintf(_stderr,"           (e.g. to rotate each Chi and the methyls for isoleucine the\n");
    fprintf(_stderr,"            sequence is: rotChi1/SAVE/rotChi2/rotCD1/RESTORE/rotCG2)\n");
    fprintf(_stderr,"   Set orientation: GO:angle1:angle2:...\n");
    fprintf(_stderr,"   Include files:   @filename\n");
    fprintf(_stderr,"   Comments:        # comment text\n");
  }
  fprintf(_stderr,"\n%s\n",versionString);
  exit(0);
}

Assistant:

void probehelp(int longlist)
{
   fprintf(stderr, "\nSyntax: probe input.pdb >> out.kin\n");
   fprintf(stderr, "    or: probe [flags] \"src pattern\" [\"target pattern\"] pdbfiles... >> out.kin\n\n");
   fprintf(stderr, "Flags:\n");
   fprintf(stderr, "  -SElf  self intersection:   src  -> src (default)\n");
   fprintf(stderr, "  -Both  intersect both ways: src <=> targ\n");
   fprintf(stderr, "  -ONce  single intersection: src  -> targ\n");
   fprintf(stderr, "  -OUt   external van der Waals surface of src (solvent contact surface)\n");
   fprintf(stderr, "\n");
   fprintf(stderr, "  -AUTObondrot filename    read and process an autobondrot file\n");
if (! longlist) {
   fprintf(stderr, "\n  shortcuts: <<NO FLAGS>>, -SCSurface, -EXPOsed, -ASurface, -ACCESS, -SCAN0, -SCAN1\n");
   fprintf(stderr, "\n most simple dotkin: probe -self all -kinemage input.pdb > out.kin\n");
}
else { /*longlist option*/
   fprintf(stderr, "\n  shortcuts:\n");
   fprintf(stderr, " <<NO FLAGS>>same as: -4H -mc -het -self \"altA ogt33\"\n");
                            /*changed from 3 : dcr041017*/
   fprintf(stderr, "  -DEFAULTs  same as: <<NO FLAGS>>, but allows some other flags\n"); /*dcr041101*/
   fprintf(stderr, "  -SCSurface same as: -drop -rad1.4         -out \"not water\"\n");
   fprintf(stderr, "  -EXPOsed   same as: -drop -rad1.4         -out      (note: user supplies pattern)\n");
   fprintf(stderr, "  -ASurface  same as: -drop -rad0.0 -add1.4 -out \"not water\"\n");
   fprintf(stderr, "  -ACCESS    same as: -drop -rad0.0 -add1.4 -out      (note: user supplies pattern)\n");
   fprintf(stderr, "  -SCAN0 same as: -4H -mc -self \"alta blt40 ogt33\"\n");
                        /*changed from 3 : dcr041017*/
   fprintf(stderr, "  -SCAN1 same as: -4H -once \"sc alta blt40 ogt33\" \"alta blt40 ogt65,(not water ogt33)\"\n");
                        /*changed from 3 : dcr041017*/
   fprintf(stderr, "\n");
   fprintf(stderr, "  -DUMPAtominfo   count the atoms in the selection: src\n\n");
   fprintf(stderr, "  (note that BOTH and ONCE require two patterns while\n");
   fprintf(stderr, "   OUT, SELF and DUMPATOMINFO require just one pattern)\n\n");
   fprintf(stderr, "  -Implicit    implicit hydrogens\n");
   fprintf(stderr, "  -Explicit    explicit hydrogens (default)\n");
   fprintf(stderr, "  -DEnsity#    set dot density (default 16 dots/sq A)\n");
   fprintf(stderr, "  -Radius#.#   set probe radius (default 0.25 A)\n");
   fprintf(stderr, "  -ADDvdw#.#   offset added to Van der Waals radii (default 0.0)\n");
   fprintf(stderr, "  -SCALEvdw#.# scale factor for Van der Waals radii (default 1.0)\n");
   fprintf(stderr, "  -COSCale#.#  scale C=O carbon Van der Waals radii (default 0.94)\n");
   fprintf(stderr, "  -SPike       draw spike instead of dots (default)\n");
   fprintf(stderr, "  -SPike#.#    set spike scale (default=0.5)\n");
   fprintf(stderr, "  -NOSpike     draw only dots\n");
   fprintf(stderr, "  -HBRegular#.# max overlap for regular Hbonds(default=%.1f)\n", Min_regular_hb_cutoff);
   fprintf(stderr, "  -HBCharged#.# max overlap for charged Hbonds(default=%.1f)\n", Min_charged_hb_cutoff);
   fprintf(stderr, "  -Keep        keep nonselected atoms (default)\n");
   fprintf(stderr, "  -DRop        drop nonselected atoms\n");
   fprintf(stderr, "  -LIMit       limit bump dots to max dist when kissing (default)\n");
   fprintf(stderr, "  -NOLIMit     do not limit bump dots\n");
   fprintf(stderr, "  -LENs        add lens keyword to kin file\n");
   fprintf(stderr, "  -NOLENs      do not add lens keyword to kin file (default)\n");
   fprintf(stderr, "  -MC          include mainchain->mainchain interactions\n");
   fprintf(stderr, "  -HETs        include dots to non-water HET groups (default)\n");
   fprintf(stderr, "  -NOHETs      exclude dots to non-water HET groups\n");
   fprintf(stderr, "  -WATers      include dots to water (default)\n");
   fprintf(stderr, "  -NOWATers    exclude dots to water\n");
   fprintf(stderr, "  -WAT2wat     show dots between waters\n");
   fprintf(stderr, "  -DUMPH2O     include water H? vectorlist in output\n");
   fprintf(stderr, "  -4H          extend bond chain dot removal to 4 for H (default)\n");
   fprintf(stderr, "  -3           limit bond chain dot removal to 3\n");
   fprintf(stderr, "  -2           limit bond chain dot removal to 2\n");
   fprintf(stderr, "  -1           limit bond chain dot removal to 1\n");
   fprintf(stderr, "  -IGNORE \"pattern\" explicit drop: ignore atoms selected by pattern\n");
   fprintf(stderr, "  -DOCHO       recognize CH..O Hbonds\n");
   fprintf(stderr, "  -CHO#.#      scale factor for CH..O Hbond score (default=%.1f)\n", CHOHBfactor);
   fprintf(stderr, "  -PolarH      use short radii of polar hydrogens (default)\n");
   fprintf(stderr, "  -NOPolarH    do not shorten radii of polar hydrogens\n");
   fprintf(stderr, "  -NUClear     use nuclear position vdW radii\n"); // 130114 JJH
   fprintf(stderr, "               (default is electron cloud positions)\n"); // 130114 JJH
   fprintf(stderr, "  -NOFACEhbond do not identify HBonds to aromatic faces\n\n");

   fprintf(stderr, "  -Name \"name\" specify the group name (default \"dots\")\n");
   fprintf(stderr, "  -DOTMASTER  group name used as extra master={name} on lists\n"); /*060129*/
   fprintf(stderr, "  -NOGroup     do not generate @group statement in .kin format output\n");
   fprintf(stderr, "  -KINemage    add @kinemage 1 statement to top of .kin format output\n\n");

   fprintf(stderr, "  -Countdots   produce a count of dots-not a dotlist\n");
   fprintf(stderr, "  -Unformated  output raw dot info\n");
   fprintf(stderr, "     name:pat:type:srcAtom:targAtom:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n");
   fprintf(stderr, "  -CONdense    raw output in condensed format, i.e. one line per source->target atom. Also gives the dot count for that interaction. Works only with -Unformated flag\n");
   fprintf(stderr, "     name:pat:type:srcAtom:targAtom:dot-count:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n");
   fprintf(stderr, "  -OFORMAT     output dot info formatted for display in O\n");
   fprintf(stderr, "  -XVFORMAT    output dot info formatted for display in XtalView\n");
   fprintf(stderr, "  -ONELINE     output one line :contacts:by:severity:type:\n"); /*dcr041101*/
   fprintf(stderr, "  -ONEDOTeach  output one dot for each src-to-neighbor\n"); /*dcr111013*/
   fprintf(stderr, "               With -Unformated flag: for H gives angle parent-src-cause,\n");
   fprintf(stderr, "     name:pat:type:srcAtom:targAtom:XHTangle:mingap:gap:spX:spY:spZ:spikeLen:score:stype:ttype:x:y:z:sBval:tBval:\n");
   fprintf(stderr, "  -GAPBINs     2nd pointmaster character, -.5...0...+.5\n"); /*dcr111020*/
   fprintf(stderr, "  -NEAREST     apply selection only on nearest neighbor\n"); /*dcr111020*/
   fprintf(stderr, "  -FILTERnearest apply 3rd selection on neighbor\n"); /*dcr111020*/
   fprintf(stderr, " e.g. -nearest -filternearest patt1 all patt3\n"); /*dcr111020*/
   fprintf(stderr, "  -OCC1filter  final filter exclude any w occ < 1\n");  /*dcr111020*/
   fprintf(stderr, "  -NOALTfilter final filter exclude any alts\n");  /*dcr111020*/
   fprintf(stderr, "  -GAPcolor    color dots by gap amount (default)\n");
   fprintf(stderr, "  -ATOMcolor   color dots by atom type\n");
   fprintf(stderr, "  -BASEcolor   color dots by nucleic acid base type\n");
   fprintf(stderr, "  -COLORBase   color dots by gap and nucleic acid base type\n");
   fprintf(stderr, "  -OUTCOLor \"name\" specify the point color for -OUT (default \"gray\")\n");
   fprintf(stderr, "  -GAPWeight#  set weight for scoring gaps (default 0.25)\n");
   fprintf(stderr, "  -BUMPWeight# set relative scale for scoring bumps (default 10.0)\n");
   fprintf(stderr, "  -HBWeight#   set relative scale for scoring Hbonds (default 4.0)\n");
   fprintf(stderr, "  -DIVLow#.#   Division for Bump categories    (default -0.4)\n");
   fprintf(stderr, "  -DIVHigh#.#  Division for Contact categories (default  0.25)\n");
   fprintf(stderr, "  -DIVWorse#.#  Division for regarding a clash as a worse clash (default  -0.5)\n"); /* 04/21/2015 SJ*/
   fprintf(stderr, "  -SEPWORSE    To separate bad overlaps and worse overlaps (default false, if true, deafult value to separate the worse clashes is -0.5)\n");
   fprintf(stderr, "  -MINOCCupancy#.#  Occupancy below this is same as zero (default  0.02)\n");
   fprintf(stderr, "  -ELEMent     add master buttons for different elements in kin output\n");
   fprintf(stderr, "  -NOHBOUT     do not output contacts for HBonds\n");
   fprintf(stderr, "  -NOCLASHOUT  do not output contacts for clashes\n");
   fprintf(stderr, "  -NOVDWOUT    do not output contacts for van der Waals interactions\n");
   fprintf(stderr, "  -ONLYBADOUT  onlybadout output bad clashes (severe overlap contacts)\n"); /*dcr041010*/
   fprintf(stderr, "  -SUMMARY     output summary list of contacts and clashes\n"); /*dcr041101*/
   fprintf(stderr, "  -ONELINE     output summary list on oneline\n"); /*dcr041101*/
   fprintf(stderr, "  -NOTICKs     do not display the residue name ticker during processing\n");
   fprintf(stderr, "  -STDBONDs    assume only standard bonding patterns in standard residues\n");
   fprintf(stderr, "  -NOPARENT    do not bond hydrogens based on table of parent heavy atoms\n\n");
   fprintf(stderr, "  -SEGID       use the PDB SegID field to descriminate between residues\n");
   fprintf(stderr, "  -OLDU        generate old style -u output: kissEdge2BullsEye, etc\n");
   fprintf(stderr, "  -VErbose     verbose mode (default)\n");
   fprintf(stderr, "  -DOTDUMP     dump dot info while doing examineDots()\n");
   fprintf(stderr, "  -DUMPATOMS filename  dump atom information to filename for regression testing\n");
   fprintf(stderr, "  -REFerence   display reference string\n");
   fprintf(stderr, "  -CHANGEs     display a list of program changes\n");
   fprintf(stderr, "  -Quiet       quiet mode\n");
}/*longlist option*/
   fprintf(stderr, "\n  -Help  show expanded help notice (includes other flags)\n");
   fprintf(stderr, "\n  -VERSION   one line version to stdout\n\n");/*dcr041009*/
   fprintf(stderr, "Pattern elements:  (should be put in quotes on the command line)\n");
if (longlist) { /*longlist option continues*/
   fprintf(stderr, "   FILE#     within file #\n");
   fprintf(stderr, "   MODEL#    within model #\n");
   fprintf(stderr, "   CHAINaa   within chain a\n");
   fprintf(stderr, "   SEGaaaa   segment identifier aaaa (where _ represents blank)\n");
   fprintf(stderr, "   ALTa      alternate conformation a\n");
   fprintf(stderr, "   ATOMaaaa  atom name aaaa (where _ represents blank)\n");
   fprintf(stderr, "             (all 4 characters are used so H would be ATOM_H__)\n");
   fprintf(stderr, "   RESaaa    residue aaa\n");
   fprintf(stderr, "   #         residue #\n");
   fprintf(stderr, "   #a        residue #, insert a\n");
   fprintf(stderr, "   #-#       residue range # (insert codes ignored)\n");
   fprintf(stderr, "   a         residue type by one letter codes   (eg. y)\n");
   fprintf(stderr, "   aaa       residue type by three letter codes (eg. tyr)\n");
   fprintf(stderr, "   ALL,PROTEIN,MC,SC,BASE,ALPHA,BETA,NITROGEN,CARBON,OXYGEN,\n");
   fprintf(stderr, "   SULFUR,PHOSPHORUS,HYDROGEN,METAL,POLAR,NONPOLAR,CHARGED,\n");
   fprintf(stderr, "   DONOR,ACCEPTOR,AROMATIC,METHYLENE,METHYL,HET,WATER,DNA,RNA\n");
   fprintf(stderr, "             all or a subset of the atoms\n");
   fprintf(stderr, "   OLT#      Occupancy less than # (integer percent)\n");
   fprintf(stderr, "   OGT#      Occupancy greater than # (integer percent)\n");
   fprintf(stderr, "   BLT#      B-value less than # (integer)\n");
   fprintf(stderr, "   BGT#      B-value greater than # (integer)\n");
   fprintf(stderr, "   INSa      Insert code a (where _ represents blank)\n");
   fprintf(stderr, "   \n");
   fprintf(stderr, "   WITHIN #.# OF #.#, #.#, #.#   atoms within distance from point\n");
}/*longlist option continues*/
else { /*NOT longlist*/
   fprintf(stderr, "   #         residue number\n");
   fprintf(stderr, "   #a        residue #, insert a\n");
   fprintf(stderr, "   #-#       residue number range\n");
   fprintf(stderr, "   a OR aaa  residue type by one or three letter codes\n");
   fprintf(stderr, "   FILE#,MODEL#,CHAINa,SEGaaaa,ALTa,ATOMaaaa,RESaaa,\n");
   fprintf(stderr, "   ALL,PROTEIN,MC,SC,BASE,ALPHA,BETA,NITROGEN,CARBON,OXYGEN,\n");
   fprintf(stderr, "   SULFUR,PHOSPHORUS,HYDROGEN,METAL,POLAR,NONPOLAR,CHARGED,\n");
   fprintf(stderr, "   DONOR,ACCEPTOR,AROMATIC,METHYLENE,METHYL,HET,WATER,DNA,RNA,\n");
   fprintf(stderr, "   OLT#, OGT#, BLT#, BGT#, INSa, WITHIN #.# OF #.#, #.#, #.#\n");
}
   fprintf(stderr, "   \n");
   fprintf(stderr, "   Patterns can be combined into comma separated lists\n");
   fprintf(stderr, "   such as \"trp,phe,tyr\" meaning TRP or PHE or TYR.\n");
   fprintf(stderr, "   \n");
   fprintf(stderr, "   Patterns that are sepatated by blanks must all be true\n");
   fprintf(stderr, "   such as \"chainb 1-5\" meaning residues 1 to 5 in chain B.\n");
   fprintf(stderr, "   \n");
   fprintf(stderr, "   You can also group patterns with parenthesis, separate\n");
   fprintf(stderr, "   multiple patterns with | meaning 'or' and choose the\n");
   fprintf(stderr, "   complement with NOT as in \"not file1\" meaning not in file 1.\n");
   fprintf(stderr, "\n");
   fprintf(stderr, "   An autobondrot file is similar to other PDB input files\n");
   fprintf(stderr, "   but it includes information identifying atoms subject to rotations\n");
   fprintf(stderr, "   and other transformations.\n");
if (longlist) { /*more longlist*/
   fprintf(stderr, "\n   Example autobondrot file fragment showing Calpha-Cbeta bond rotation\n");
   fprintf(stderr, "   and a periodic torsion penalty function for this rotation\n");
   fprintf(stderr, "     ATOM      1  CB  TYR    61      34.219  17.937   4.659  1.00  0.00\n");
   fprintf(stderr, "     bondrot:chi1:78.7:  0:359:5:33.138:18.517: 5.531:34.219:17.937: 4.659\n");
   fprintf(stderr, "     cos:-3:60:3:\n");
   fprintf(stderr, "     ATOM      1 1HB  TYR    61      34.766  18.777   4.206  1.00  0.00\n");
   fprintf(stderr, "     ATOM      1 2HB  TYR    61      34.927  17.409   5.315  1.00  0.00\n");
   fprintf(stderr, "     ATOM      1  CG  TYR    61      33.836  16.989   3.546  1.00  0.00\n");
   fprintf(stderr, "     ...\n");

   fprintf(stderr, "   Autobondrot commands use colons to separate values\n");
   fprintf(stderr, "   Transformations: BONDROT:id:currAng:start:end:stepSz:x1:y1:z1:x2:y2:z2\n");
   fprintf(stderr, "                    TRANS:  id:currpos:start:end:stepSz:x1:y1:z1:x2:y2:z2\n");
   fprintf(stderr, "                    NULL  # dummy\n");
   fprintf(stderr, "   Bias functions:  COS:scale:phaseOffset:frequency\n");
   fprintf(stderr, "                    POLY:scale:offset:polynomialDegree\n");
   fprintf(stderr, "                    CONST:value\n");
   fprintf(stderr, "   Branching:       SAVE and RESTORE or \"(\" and \")\"\n");
   fprintf(stderr, "           (e.g. to rotate each Chi and the methyls for isoleucine the\n");
   fprintf(stderr, "            sequence is: rotChi1/SAVE/rotChi2/rotCD1/RESTORE/rotCG2)\n");
   fprintf(stderr, "   Set orientation: GO:angle1:angle2:...\n");
   fprintf(stderr, "   Include files:   @filename\n");
   fprintf(stderr, "   Comments:        # comment text\n");
}/*more longlist*/
   fprintf(stderr, "\n%s\n", versionString);
   exit(0);
}